

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O0

int __thiscall llvm::StringMapImpl::init(StringMapImpl *this,EVP_PKEY_CTX *ctx)

{
  StringMapEntryBase **ppSVar1;
  uint local_2c;
  uint NewNumBuckets;
  uint InitSize_local;
  StringMapImpl *this_local;
  
  local_2c = (uint)ctx;
  if ((local_2c & local_2c - 1) == 0) {
    if (local_2c == 0) {
      local_2c = 0x10;
    }
    this->NumItems = 0;
    this->NumTombstones = 0;
    ppSVar1 = (StringMapEntryBase **)safe_calloc((ulong)(local_2c + 1),0xc);
    this->TheTable = ppSVar1;
    this->NumBuckets = local_2c;
    ppSVar1 = this->TheTable;
    ppSVar1[this->NumBuckets] = (StringMapEntryBase *)0x2;
    return (int)ppSVar1;
  }
  __assert_fail("(InitSize & (InitSize-1)) == 0 && \"Init Size must be a power of 2 or zero!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/StringMap.cpp"
                ,0x37,"void llvm::StringMapImpl::init(unsigned int)");
}

Assistant:

void StringMapImpl::init(unsigned InitSize) {
  assert((InitSize & (InitSize-1)) == 0 &&
         "Init Size must be a power of 2 or zero!");

  unsigned NewNumBuckets = InitSize ? InitSize : 16;
  NumItems = 0;
  NumTombstones = 0;

  TheTable = static_cast<StringMapEntryBase **>(
      safe_calloc(NewNumBuckets+1,
                  sizeof(StringMapEntryBase **) + sizeof(unsigned)));

  // Set the member only if TheTable was successfully allocated
  NumBuckets = NewNumBuckets;

  // Allocate one extra bucket, set it to look filled so the iterators stop at
  // end.
  TheTable[NumBuckets] = (StringMapEntryBase*)2;
}